

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strglob(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iBool;
  u8 *zPattern;
  u8 *zString;
  
  iBool = 0;
  if (((1 < nArg) && (((*apArg)->iFlags & 1) != 0)) && (iBool = 0, (apArg[1]->iFlags & 1) != 0)) {
    zPattern = (u8 *)jx9_value_to_string(*apArg,(int *)0x0);
    zString = (u8 *)jx9_value_to_string(apArg[1],(int *)0x0);
    iBool = patternCompare(zPattern,zString,0x5c,0);
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Builtin_strglob(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, 0);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}